

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

connectdata * allocate_conn(Curl_easy *data)

{
  curl_mimepart *pcVar1;
  char *pcVar2;
  curltime cVar3;
  byte local_44;
  bool local_43;
  bool local_42;
  bool local_41;
  bool local_31;
  undefined4 uStack_24;
  connectdata *conn;
  Curl_easy *data_local;
  
  data_local = (Curl_easy *)(*Curl_ccalloc)(1,0x5c0);
  if (data_local == (Curl_easy *)0x0) {
    data_local = (Curl_easy *)0x0;
  }
  else {
    *(undefined4 *)&(data_local->set).seek_client = 0xffffffff;
    *(undefined4 *)((long)&(data_local->set).seek_client + 4) = 0xffffffff;
    pcVar1 = &(data_local->set).mimepost;
    (pcVar1->encstate).buf[0x58] = -1;
    (pcVar1->encstate).buf[0x59] = -1;
    (pcVar1->encstate).buf[0x5a] = -1;
    (pcVar1->encstate).buf[0x5b] = -1;
    pcVar1 = &(data_local->set).mimepost;
    (pcVar1->encstate).buf[0x5c] = -1;
    (pcVar1->encstate).buf[0x5d] = -1;
    (pcVar1->encstate).buf[0x5e] = -1;
    (pcVar1->encstate).buf[0x5f] = -1;
    *(undefined8 *)&(data_local->msg).extmsg = 0xffffffffffffffff;
    *(int *)((long)&(data_local->set).writeheader + 4) = -1;
    *(undefined4 *)&(data_local->set).proxy_ssl.primary.CApath = 0xffffffff;
    Curl_conncontrol((connectdata *)data_local,1);
    cVar3 = Curl_now();
    (data_local->set).fclosesocket = (curl_closesocket_callback)cVar3.tv_sec;
    (data_local->set).closesocket_client = (void *)CONCAT44(uStack_24,cVar3.tv_usec);
    *(curl_closesocket_callback *)((data_local->set).mimepost.encstate.buf + 0x48) =
         (data_local->set).fclosesocket;
    *(void **)((data_local->set).mimepost.encstate.buf + 0x50) =
         (data_local->set).closesocket_client;
    *(uchar *)((long)&(data_local->req).sendbuf.max_chunks + 4) = (data->set).proxytype;
    *(undefined1 *)((long)&(data_local->req).writer_stack + 4) = 4;
    local_31 = false;
    if ((data->set).str[0x26] != (char *)0x0) {
      local_31 = *(data->set).str[0x26] != '\0';
    }
    *(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) =
         *(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) & 0xffffffffffffffef |
         (ulong)local_31 << 4;
    local_41 = false;
    if ((*(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) >> 4 & 1) != 0) {
      local_42 = true;
      if ((*(char *)((long)&(data_local->req).sendbuf.max_chunks + 4) != '\0') &&
         (local_42 = true, *(char *)((long)&(data_local->req).sendbuf.max_chunks + 4) != '\x01')) {
        local_43 = true;
        if (*(char *)((long)&(data_local->req).sendbuf.max_chunks + 4) != '\x02') {
          local_43 = *(char *)((long)&(data_local->req).sendbuf.max_chunks + 4) == '\x03';
        }
        local_42 = local_43;
      }
      local_41 = local_42;
    }
    *(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) =
         *(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) & 0xfffffffffffffffe |
         (ulong)local_41;
    local_44 = 0;
    if ((*(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) >> 4 & 1) != 0) {
      local_44 = (*(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) & 1) != 0 ^ 0xff;
    }
    *(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) =
         *(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) & 0xfffffffffffffffd |
         (ulong)(local_44 & 1) << 1;
    if (((data->set).str[0x27] != (char *)0x0) && (*(data->set).str[0x27] != '\0')) {
      *(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) =
           *(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) & 0xffffffffffffffef | 0x10;
      *(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) =
           *(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) & 0xfffffffffffffffd | 2;
    }
    *(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) =
         *(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) & 0xfffffffffffffffb |
         (ulong)((data->state).aptr.proxyuser != (char *)0x0) << 2;
    *(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) =
         *(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) & 0xfffffffffffffff7 |
         (ulong)((uint)(*(ulong *)&(data->set).field_0x89c >> 0xb) & 1) << 3;
    *(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) =
         *(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) & 0xffffffffffff7fff |
         (ulong)((uint)((ulong)*(undefined8 *)&(data->set).field_0x89c >> 0x10) & 1) << 0xf;
    *(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) =
         *(ulong *)((data_local->set).mimepost.encstate.buf + 0x30) & 0xfffffffffffeffff |
         (ulong)((uint)(*(ulong *)&(data->set).field_0x89c >> 0x11) & 1) << 0x10;
    *(uchar *)((long)&(data_local->set).proxy_ssl.primary.issuercert + 3) = (data->set).ipver;
    *(byte *)((long)&(data_local->set).proxy_ssl.primary.issuercert + 5) =
         (byte)*(undefined8 *)&(data->set).field_0x89c & 1;
    *(undefined1 *)((long)&(data_local->set).proxy_ssl.primary.issuercert + 2) = 3;
    Curl_uint_spbset_init((uint_spbset *)((data_local->set).mimepost.encstate.buf + 0x60));
    if ((data->set).str[0x1e] != (char *)0x0) {
      pcVar2 = (*Curl_cstrdup)((data->set).str[0x1e]);
      (data_local->set).ssl.key_passwd = pcVar2;
      if ((data_local->set).ssl.key_passwd == (char *)0x0) {
        (*Curl_cfree)((data_local->set).ssl.key_passwd);
        (*Curl_cfree)(data_local);
        return (connectdata *)(Curl_easy *)0x0;
      }
    }
    *(unsigned_short *)&(data_local->set).ssl.field_0xc8 = (data->set).localportrange;
    *(unsigned_short *)((long)&(data_local->set).proxy_ssl.primary.CAfile + 4) =
         (data->set).localport;
    (data_local->msg).list._prev = (Curl_llist_node *)(data->set).fclosesocket;
    (data_local->msg).list._next = (Curl_llist_node *)(data->set).closesocket_client;
    (data_local->set).fprereq = (curl_prereq_callback)(data_local->set).fclosesocket;
    (data_local->set).prereq_userp = (data_local->set).closesocket_client;
  }
  return (connectdata *)data_local;
}

Assistant:

static struct connectdata *allocate_conn(struct Curl_easy *data)
{
  struct connectdata *conn = calloc(1, sizeof(struct connectdata));
  if(!conn)
    return NULL;

  /* and we setup a few fields in case we end up actually using this struct */

  conn->sock[FIRSTSOCKET] = CURL_SOCKET_BAD;     /* no file descriptor */
  conn->sock[SECONDARYSOCKET] = CURL_SOCKET_BAD; /* no file descriptor */
  conn->sockfd = CURL_SOCKET_BAD;
  conn->writesockfd = CURL_SOCKET_BAD;
  conn->connection_id = -1;    /* no ID */
  conn->primary.remote_port = -1; /* unknown at this point */
  conn->remote_port = -1; /* unknown at this point */

  /* Default protocol-independent behavior does not support persistent
     connections, so we set this to force-close. Protocols that support
     this need to set this to FALSE in their "curl_do" functions. */
  connclose(conn, "Default to force-close");

  /* Store creation time to help future close decision making */
  conn->created = Curl_now();

  /* Store current time to give a baseline to keepalive connection times. */
  conn->keepalive = conn->created;

#ifndef CURL_DISABLE_PROXY
  conn->http_proxy.proxytype = data->set.proxytype;
  conn->socks_proxy.proxytype = CURLPROXY_SOCKS4;

  /* note that these two proxy bits are now just on what looks to be
     requested, they may be altered down the road */
  conn->bits.proxy = (data->set.str[STRING_PROXY] &&
                      *data->set.str[STRING_PROXY]);
  conn->bits.httpproxy = (conn->bits.proxy &&
                          (conn->http_proxy.proxytype == CURLPROXY_HTTP ||
                           conn->http_proxy.proxytype == CURLPROXY_HTTP_1_0 ||
                           IS_HTTPS_PROXY(conn->http_proxy.proxytype)));
  conn->bits.socksproxy = (conn->bits.proxy && !conn->bits.httpproxy);

  if(data->set.str[STRING_PRE_PROXY] && *data->set.str[STRING_PRE_PROXY]) {
    conn->bits.proxy = TRUE;
    conn->bits.socksproxy = TRUE;
  }

  conn->bits.proxy_user_passwd = !!data->state.aptr.proxyuser;
  conn->bits.tunnel_proxy = data->set.tunnel_thru_httpproxy;
#endif /* CURL_DISABLE_PROXY */

#ifndef CURL_DISABLE_FTP
  conn->bits.ftp_use_epsv = data->set.ftp_use_epsv;
  conn->bits.ftp_use_eprt = data->set.ftp_use_eprt;
#endif
  conn->ip_version = data->set.ipver;
  conn->connect_only = data->set.connect_only;
  conn->transport = TRNSPRT_TCP; /* most of them are TCP streams */

  /* Initialize the attached xfers bitset */
  Curl_uint_spbset_init(&conn->xfers_attached);

#ifdef HAVE_GSSAPI
  conn->data_prot = PROT_CLEAR;
#endif

  /* Store the local bind parameters that will be used for this connection */
  if(data->set.str[STRING_DEVICE]) {
    conn->localdev = strdup(data->set.str[STRING_DEVICE]);
    if(!conn->localdev)
      goto error;
  }
#ifndef CURL_DISABLE_BINDLOCAL
  conn->localportrange = data->set.localportrange;
  conn->localport = data->set.localport;
#endif

  /* the close socket stuff needs to be copied to the connection struct as
     it may live on without (this specific) Curl_easy */
  conn->fclosesocket = data->set.fclosesocket;
  conn->closesocket_client = data->set.closesocket_client;
  conn->lastused = conn->created;
#ifdef HAVE_GSSAPI
  conn->gssapi_delegation = data->set.gssapi_delegation;
#endif
  return conn;
error:

  free(conn->localdev);
  free(conn);
  return NULL;
}